

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O0

bilingual_str *
util::ErrorString<std::unique_ptr<AddrMan,std::default_delete<AddrMan>>>
          (Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *result)

{
  long lVar1;
  bool bVar2;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = Result::operator_cast_to_bool(in_stack_ffffffffffffffa8);
  uVar3 = 0;
  if (bVar2) {
    std::__cxx11::string::string(&in_RDI->original);
    std::__cxx11::string::string(&in_RDI->original);
  }
  else {
    std::get<0ul,bilingual_str,std::unique_ptr<AddrMan,std::default_delete<AddrMan>>>
              (&in_stack_ffffffffffffffa8->m_variant);
    bilingual_str::bilingual_str((bilingual_str *)CONCAT17(uVar3,in_stack_ffffffffffffffc8),in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str ErrorString(const Result<T>& result)
{
    return result ? bilingual_str{} : std::get<0>(result.m_variant);
}